

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

void __thiscall glslang::TGlslIoMapper::~TGlslIoMapper(TGlslIoMapper *this)

{
  ~TGlslIoMapper(this);
  operator_delete(this,0x208);
  return;
}

Assistant:

TGlslIoMapper::~TGlslIoMapper() {
    for (size_t stage = 0; stage < EShLangCount; stage++) {
        if (inVarMaps[stage] != nullptr) {
            delete inVarMaps[stage];
            inVarMaps[stage] = nullptr;
        }
        if (outVarMaps[stage] != nullptr) {
            delete outVarMaps[stage];
            outVarMaps[stage] = nullptr;
        }
        if (uniformVarMap[stage] != nullptr) {
            delete uniformVarMap[stage];
            uniformVarMap[stage] = nullptr;
        }
        if (intermediates[stage] != nullptr)
            intermediates[stage] = nullptr;
    }
}